

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::DiskSourceTree::MapPath
          (DiskSourceTree *this,string *virtual_path,string *disk_path)

{
  Mapping *this_00;
  string *in_RDX;
  long in_RDI;
  value_type *in_stack_ffffffffffffff38;
  string *disk_path_param;
  string *in_stack_ffffffffffffff58;
  Mapping *in_stack_ffffffffffffff60;
  string local_98;
  string local_78 [80];
  string *in_stack_ffffffffffffffd8;
  
  this_00 = (Mapping *)(in_RDI + 8);
  disk_path_param = &local_98;
  std::__cxx11::string::string((string *)disk_path_param,in_RDX);
  CanonicalizePath(in_stack_ffffffffffffffd8);
  Mapping::Mapping(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,disk_path_param);
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::push_back((vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               *)this_00,in_stack_ffffffffffffff38);
  Mapping::~Mapping(this_00);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void DiskSourceTree::MapPath(const std::string& virtual_path,
                             const std::string& disk_path) {
  mappings_.push_back(Mapping(virtual_path, CanonicalizePath(disk_path)));
}